

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fq.c
# Opt level: O2

int nn_fq_recv(nn_fq *self,nn_msg *msg,nn_pipe **pipe)

{
  FILE *__stream;
  uint uVar1;
  nn_pipe *self_00;
  char *pcVar2;
  
  self_00 = nn_priolist_getpipe(&self->priolist);
  if (self_00 == (nn_pipe *)0x0) {
    uVar1 = 0xfffffff5;
  }
  else {
    uVar1 = nn_pipe_recv(self_00,msg);
    if ((int)uVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(-uVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-uVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/utils/fq.c"
              ,0x49);
      fflush(_stderr);
      nn_err_abort();
    }
    if (pipe != (nn_pipe **)0x0) {
      *pipe = self_00;
    }
    nn_priolist_advance(&self->priolist,uVar1 & 1);
    uVar1 = uVar1 & 0x7ffffffe;
  }
  return uVar1;
}

Assistant:

int nn_fq_recv (struct nn_fq *self, struct nn_msg *msg, struct nn_pipe **pipe)
{
    int rc;
    struct nn_pipe *p;

    /*  Pipe is NULL only when there are no avialable pipes. */
    p = nn_priolist_getpipe (&self->priolist);
    if (nn_slow (!p))
        return -EAGAIN;

    /*  Receive the messsage. */
    rc = nn_pipe_recv (p, msg);
    errnum_assert (rc >= 0, -rc);

    /*  Return the pipe data to the user, if required. */
    if (pipe)
        *pipe = p;

    /*  Move to the next pipe. */
    nn_priolist_advance (&self->priolist, rc & NN_PIPE_RELEASE);

    return rc & ~NN_PIPE_RELEASE;
}